

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersectorKHybrid<4,_8,_16781328,_true,_embree::avx512::VirtualCurveIntersectorK<8>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  byte bVar1;
  BVH *bvh;
  void *pvVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  undefined8 uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  size_t k;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  byte bVar25;
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  char cVar34;
  byte bVar35;
  byte bVar36;
  size_t mask;
  ulong uVar37;
  uint uVar38;
  undefined4 uVar39;
  long lVar40;
  ulong *puVar41;
  uint uVar42;
  NodeRef root;
  undefined1 (*pauVar43) [32];
  bool bVar44;
  ulong uVar45;
  ulong uVar46;
  ulong uVar47;
  undefined1 auVar49 [16];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar50 [16];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar51 [16];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 in_ZMM1 [64];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [16];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 in_ZMM4 [64];
  float fVar82;
  float fVar86;
  float fVar87;
  float fVar88;
  undefined1 auVar83 [16];
  float fVar89;
  float fVar90;
  float fVar91;
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  vfloat4 a0;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [32];
  undefined1 auVar101 [16];
  undefined1 auVar102 [32];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [32];
  undefined1 auVar106 [64];
  undefined1 auVar107 [64];
  undefined1 auVar108 [64];
  undefined1 auVar109 [64];
  undefined1 auVar110 [64];
  undefined1 auVar111 [64];
  undefined1 auVar112 [64];
  undefined1 auVar113 [64];
  undefined1 auVar114 [64];
  undefined1 auVar115 [64];
  undefined1 in_ZMM28 [64];
  undefined1 auVar116 [64];
  undefined1 auVar117 [64];
  undefined1 auVar118 [64];
  TravRayK<8,_true> tray;
  Precalculations pre;
  NodeRef stack_node [241];
  vfloat<8> stack_near [241];
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_2980;
  undefined1 local_2920 [32];
  undefined1 local_2900 [32];
  undefined1 local_28e0 [32];
  undefined1 local_28c0 [32];
  undefined1 local_28a0 [8];
  float fStack_2898;
  float fStack_2894;
  float fStack_2890;
  float fStack_288c;
  float fStack_2888;
  undefined4 uStack_2884;
  undefined1 local_2880 [8];
  float fStack_2878;
  float fStack_2874;
  float fStack_2870;
  float fStack_286c;
  float fStack_2868;
  undefined4 uStack_2864;
  undefined1 local_2860 [32];
  uint local_2840;
  uint uStack_283c;
  uint uStack_2838;
  uint uStack_2834;
  uint uStack_2830;
  uint uStack_282c;
  uint uStack_2828;
  uint uStack_2824;
  uint local_2820;
  uint uStack_281c;
  uint uStack_2818;
  uint uStack_2814;
  uint uStack_2810;
  uint uStack_280c;
  uint uStack_2808;
  uint uStack_2804;
  uint local_2800;
  uint uStack_27fc;
  uint uStack_27f8;
  uint uStack_27f4;
  uint uStack_27f0;
  uint uStack_27ec;
  uint uStack_27e8;
  uint uStack_27e4;
  undefined1 local_27e0 [32];
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_27c0;
  undefined1 local_27a0 [16];
  undefined1 auStack_2790 [16];
  undefined1 auStack_2780 [368];
  undefined8 local_2610;
  size_t local_2608;
  ulong local_2600 [240];
  undefined1 local_1e80 [32];
  uint local_1e60;
  uint uStack_1e5c;
  uint uStack_1e58;
  uint uStack_1e54;
  uint uStack_1e50;
  uint uStack_1e4c;
  uint uStack_1e48;
  uint uStack_1e44;
  undefined1 local_1e40 [7696];
  int iVar48;
  int iVar69;
  int iVar70;
  int iVar71;
  int iVar72;
  int iVar73;
  int iVar74;
  int iVar75;
  
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    auVar57 = *(undefined1 (*) [32])(ray + 0x100);
    auVar53 = vpcmpeqd_avx2(in_ZMM1._0_32_,in_ZMM1._0_32_);
    uVar45 = vcmpps_avx512vl(auVar57,ZEXT1632(ZEXT816(0) << 0x40),5);
    uVar37 = vpcmpeqd_avx512vl(auVar53,(undefined1  [32])valid_i->field_0);
    uVar45 = uVar45 & uVar37;
    bVar36 = (byte)uVar45;
    if (bVar36 != 0) {
      local_2920 = *(undefined1 (*) [32])(ray + 0x80);
      local_2900 = *(undefined1 (*) [32])(ray + 0xa0);
      local_28e0 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar106._0_4_ = local_28e0._0_4_ * local_28e0._0_4_;
      auVar106._4_4_ = local_28e0._4_4_ * local_28e0._4_4_;
      auVar106._8_4_ = local_28e0._8_4_ * local_28e0._8_4_;
      auVar106._12_4_ = local_28e0._12_4_ * local_28e0._12_4_;
      auVar106._16_4_ = local_28e0._16_4_ * local_28e0._16_4_;
      auVar106._20_4_ = local_28e0._20_4_ * local_28e0._20_4_;
      auVar106._28_36_ = in_ZMM4._28_36_;
      auVar106._24_4_ = local_28e0._24_4_ * local_28e0._24_4_;
      auVar51 = vfmadd231ps_fma(auVar106._0_32_,local_2900,local_2900);
      auVar51 = vfmadd231ps_fma(ZEXT1632(auVar51),local_2920,local_2920);
      auVar52 = vrsqrt14ps_avx512vl(ZEXT1632(auVar51));
      auVar53._8_4_ = 0xbf000000;
      auVar53._0_8_ = 0xbf000000bf000000;
      auVar53._12_4_ = 0xbf000000;
      auVar53._16_4_ = 0xbf000000;
      auVar53._20_4_ = 0xbf000000;
      auVar53._24_4_ = 0xbf000000;
      auVar53._28_4_ = 0xbf000000;
      auVar53 = vmulps_avx512vl(ZEXT1632(auVar51),auVar53);
      fVar82 = auVar52._0_4_;
      fVar86 = auVar52._4_4_;
      fVar87 = auVar52._8_4_;
      fVar88 = auVar52._12_4_;
      fVar89 = auVar52._16_4_;
      fVar90 = auVar52._20_4_;
      fVar91 = auVar52._24_4_;
      auVar51._0_4_ = fVar82 * fVar82;
      auVar51._4_4_ = fVar86 * fVar86;
      auVar51._8_4_ = fVar87 * fVar87;
      auVar51._12_4_ = fVar88 * fVar88;
      auVar55._4_4_ = auVar51._4_4_ * fVar86 * auVar53._4_4_;
      auVar55._0_4_ = auVar51._0_4_ * fVar82 * auVar53._0_4_;
      auVar55._8_4_ = auVar51._8_4_ * fVar87 * auVar53._8_4_;
      auVar55._12_4_ = auVar51._12_4_ * fVar88 * auVar53._12_4_;
      auVar55._16_4_ = fVar89 * fVar89 * fVar89 * auVar53._16_4_;
      auVar55._20_4_ = fVar90 * fVar90 * fVar90 * auVar53._20_4_;
      auVar55._24_4_ = fVar91 * fVar91 * fVar91 * auVar53._24_4_;
      auVar55._28_4_ = auVar53._28_4_;
      auVar54._8_4_ = 0x3fc00000;
      auVar54._0_8_ = 0x3fc000003fc00000;
      auVar54._12_4_ = 0x3fc00000;
      auVar54._16_4_ = 0x3fc00000;
      auVar54._20_4_ = 0x3fc00000;
      auVar54._24_4_ = 0x3fc00000;
      auVar54._28_4_ = 0x3fc00000;
      local_27c0 = (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1)
                   vfmadd231ps_avx512vl(auVar55,auVar52,auVar54);
      auVar79._8_4_ = 0x80000000;
      auVar79._0_8_ = 0x8000000080000000;
      auVar79._12_4_ = 0x80000000;
      auVar83._12_4_ = 0;
      auVar83._0_12_ = ZEXT812(0);
      auVar83 = auVar83 << 0x20;
      auVar51 = vpcmpeqd_avx(auVar51,auVar51);
      uVar37 = uVar45;
      do {
        lVar40 = 0;
        for (uVar47 = uVar37; (uVar47 & 1) == 0; uVar47 = uVar47 >> 1 | 0x8000000000000000) {
          lVar40 = lVar40 + 1;
        }
        uVar47 = (ulong)(uint)((int)lVar40 * 4);
        auVar49 = vinsertps_avx(ZEXT416(*(uint *)(ray + uVar47 + 0x80)),
                                ZEXT416(*(uint *)(ray + uVar47 + 0xa0)),0x1c);
        fVar82 = *(float *)((long)&local_27c0 + uVar47);
        auVar49 = vinsertps_avx(auVar49,ZEXT416(*(uint *)(ray + uVar47 + 0xc0)),0x28);
        auVar97._0_4_ = auVar49._0_4_ * fVar82;
        auVar97._4_4_ = auVar49._4_4_ * fVar82;
        auVar97._8_4_ = auVar49._8_4_ * fVar82;
        auVar97._12_4_ = auVar49._12_4_ * fVar82;
        auVar49 = vshufpd_avx(auVar97,auVar97,1);
        auVar98 = vmovshdup_avx(auVar97);
        auVar99 = vunpckhps_avx(auVar97,auVar83);
        auVar50._0_8_ = auVar49._0_8_ ^ 0x8000000080000000;
        auVar50._8_8_ = auVar49._8_8_ ^ auVar79._8_8_;
        auVar50 = vinsertps_avx(auVar50,auVar97,0x2a);
        auVar49 = vdpps_avx(auVar50,auVar50,0x7f);
        auVar99 = vshufps_avx(auVar99,ZEXT416(auVar98._0_4_ ^ 0x80000000),0x41);
        auVar98 = vdpps_avx(auVar99,auVar99,0x7f);
        uVar10 = vcmpps_avx512vl(auVar49,auVar98,1);
        auVar49 = vpmovm2d_avx512vl(uVar10);
        auVar103._0_4_ = auVar49._0_4_;
        auVar103._4_4_ = auVar103._0_4_;
        auVar103._8_4_ = auVar103._0_4_;
        auVar103._12_4_ = auVar103._0_4_;
        uVar47 = vpmovd2m_avx512vl(auVar103);
        auVar49._4_4_ = (uint)((byte)(uVar47 >> 1) & 1) * auVar51._4_4_;
        auVar49._0_4_ = (uint)((byte)uVar47 & 1) * auVar51._0_4_;
        auVar49._8_4_ = (uint)((byte)(uVar47 >> 2) & 1) * auVar51._8_4_;
        auVar49._12_4_ = (uint)((byte)(uVar47 >> 3) & 1) * auVar51._12_4_;
        auVar49 = vblendvps_avx(auVar50,auVar99,auVar49);
        auVar98 = vdpps_avx(auVar49,auVar49,0x7f);
        auVar50 = vrsqrt14ss_avx512f(auVar83,ZEXT416((uint)auVar98._0_4_));
        fVar86 = auVar50._0_4_;
        fVar86 = fVar86 * 1.5 - auVar98._0_4_ * 0.5 * fVar86 * fVar86 * fVar86;
        auVar99._0_4_ = auVar49._0_4_ * fVar86;
        auVar99._4_4_ = auVar49._4_4_ * fVar86;
        auVar99._8_4_ = auVar49._8_4_ * fVar86;
        auVar99._12_4_ = auVar49._12_4_ * fVar86;
        auVar49 = vshufps_avx(auVar99,auVar99,0xc9);
        auVar98 = vshufps_avx(auVar97,auVar97,0xc9);
        auVar104._0_4_ = auVar99._0_4_ * auVar98._0_4_;
        auVar104._4_4_ = auVar99._4_4_ * auVar98._4_4_;
        auVar104._8_4_ = auVar99._8_4_ * auVar98._8_4_;
        auVar104._12_4_ = auVar99._12_4_ * auVar98._12_4_;
        auVar49 = vfmsub231ps_fma(auVar104,auVar97,auVar49);
        lVar40 = lVar40 * 0x30;
        auVar98 = vshufps_avx(auVar49,auVar49,0xc9);
        auVar49 = vdpps_avx(auVar98,auVar98,0x7f);
        uVar37 = uVar37 - 1 & uVar37;
        auVar50 = vrsqrt14ss_avx512f(auVar83,ZEXT416((uint)auVar49._0_4_));
        fVar86 = auVar50._0_4_;
        auVar110 = ZEXT464((uint)(fVar86 * fVar86));
        auVar108 = ZEXT464((uint)(fVar86 * 1.5));
        fVar86 = fVar86 * 1.5 - auVar49._0_4_ * 0.5 * fVar86 * fVar86 * fVar86;
        auVar106 = ZEXT1664(CONCAT412(fVar86,CONCAT48(fVar86,CONCAT44(fVar86,fVar86))));
        auVar101._0_4_ = fVar86 * auVar98._0_4_;
        auVar101._4_4_ = fVar86 * auVar98._4_4_;
        auVar101._8_4_ = fVar86 * auVar98._8_4_;
        auVar101._12_4_ = fVar86 * auVar98._12_4_;
        auVar98._0_4_ = fVar82 * auVar97._0_4_;
        auVar98._4_4_ = fVar82 * auVar97._4_4_;
        auVar98._8_4_ = fVar82 * auVar97._8_4_;
        auVar98._12_4_ = fVar82 * auVar97._12_4_;
        auVar50 = vunpcklps_avx(auVar99,auVar98);
        auVar49 = vunpckhps_avx(auVar99,auVar98);
        auVar99 = vunpcklps_avx(auVar101,auVar83);
        auVar98 = vunpckhps_avx(auVar101,auVar83);
        auVar98 = vunpcklps_avx(auVar49,auVar98);
        auVar97 = vunpcklps_avx(auVar50,auVar99);
        auVar49 = vunpckhps_avx(auVar50,auVar99);
        *(undefined1 (*) [16])(local_27a0 + lVar40) = auVar97;
        *(undefined1 (*) [16])(auStack_2790 + lVar40) = auVar49;
        *(undefined1 (*) [16])(auStack_2780 + lVar40) = auVar98;
      } while (uVar37 != 0);
      local_2980._0_8_ = *(undefined8 *)ray;
      local_2980._8_8_ = *(undefined8 *)(ray + 8);
      local_2980._16_8_ = *(undefined8 *)(ray + 0x10);
      local_2980._24_8_ = *(undefined8 *)(ray + 0x18);
      local_2980._32_8_ = *(undefined8 *)(ray + 0x20);
      local_2980._40_8_ = *(undefined8 *)(ray + 0x28);
      local_2980._48_8_ = *(undefined8 *)(ray + 0x30);
      local_2980._56_8_ = *(undefined8 *)(ray + 0x38);
      local_2980._64_8_ = *(undefined8 *)(ray + 0x40);
      local_2980._72_8_ = *(undefined8 *)(ray + 0x48);
      local_2980._80_8_ = *(undefined8 *)(ray + 0x50);
      local_2980._88_8_ = *(undefined8 *)(ray + 0x58);
      auVar58._8_4_ = 0x7fffffff;
      auVar58._0_8_ = 0x7fffffff7fffffff;
      auVar58._12_4_ = 0x7fffffff;
      auVar58._16_4_ = 0x7fffffff;
      auVar58._20_4_ = 0x7fffffff;
      auVar58._24_4_ = 0x7fffffff;
      auVar58._28_4_ = 0x7fffffff;
      auVar53 = vandps_avx(local_2920,auVar58);
      auVar54 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      auVar114 = ZEXT3264(auVar54);
      uVar37 = vcmpps_avx512vl(auVar53,auVar54,1);
      auVar55 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar115 = ZEXT3264(auVar55);
      auVar52 = vdivps_avx512vl(auVar55,local_2920);
      auVar53 = vandps_avx(local_2900,auVar58);
      uVar47 = vcmpps_avx512vl(auVar53,auVar54,1);
      auVar56 = vdivps_avx512vl(auVar55,local_2900);
      auVar53 = vandps_avx(local_28e0,auVar58);
      uVar11 = vcmpps_avx512vl(auVar53,auVar54,1);
      auVar53 = vdivps_avx512vl(auVar55,local_28e0);
      bVar44 = (bool)((byte)uVar37 & 1);
      local_28c0._0_4_ = (uint)bVar44 * 0x5d5e0b6b | (uint)!bVar44 * auVar52._0_4_;
      bVar44 = (bool)((byte)(uVar37 >> 1) & 1);
      local_28c0._4_4_ = (uint)bVar44 * 0x5d5e0b6b | (uint)!bVar44 * auVar52._4_4_;
      bVar44 = (bool)((byte)(uVar37 >> 2) & 1);
      local_28c0._8_4_ = (uint)bVar44 * 0x5d5e0b6b | (uint)!bVar44 * auVar52._8_4_;
      bVar44 = (bool)((byte)(uVar37 >> 3) & 1);
      local_28c0._12_4_ = (uint)bVar44 * 0x5d5e0b6b | (uint)!bVar44 * auVar52._12_4_;
      bVar44 = (bool)((byte)(uVar37 >> 4) & 1);
      local_28c0._16_4_ = (uint)bVar44 * 0x5d5e0b6b | (uint)!bVar44 * auVar52._16_4_;
      bVar44 = (bool)((byte)(uVar37 >> 5) & 1);
      local_28c0._20_4_ = (uint)bVar44 * 0x5d5e0b6b | (uint)!bVar44 * auVar52._20_4_;
      bVar44 = (bool)((byte)(uVar37 >> 6) & 1);
      local_28c0._24_4_ = (uint)bVar44 * 0x5d5e0b6b | (uint)!bVar44 * auVar52._24_4_;
      bVar44 = SUB81(uVar37 >> 7,0);
      local_28c0._28_4_ = (uint)bVar44 * 0x5d5e0b6b | (uint)!bVar44 * auVar52._28_4_;
      bVar44 = (bool)((byte)uVar47 & 1);
      local_28a0._0_4_ = (uint)bVar44 * 0x5d5e0b6b | (uint)!bVar44 * auVar56._0_4_;
      bVar44 = (bool)((byte)(uVar47 >> 1) & 1);
      local_28a0._4_4_ = (uint)bVar44 * 0x5d5e0b6b | (uint)!bVar44 * auVar56._4_4_;
      bVar44 = (bool)((byte)(uVar47 >> 2) & 1);
      fStack_2898 = (float)((uint)bVar44 * 0x5d5e0b6b | (uint)!bVar44 * auVar56._8_4_);
      bVar44 = (bool)((byte)(uVar47 >> 3) & 1);
      fStack_2894 = (float)((uint)bVar44 * 0x5d5e0b6b | (uint)!bVar44 * auVar56._12_4_);
      bVar44 = (bool)((byte)(uVar47 >> 4) & 1);
      fStack_2890 = (float)((uint)bVar44 * 0x5d5e0b6b | (uint)!bVar44 * auVar56._16_4_);
      bVar44 = (bool)((byte)(uVar47 >> 5) & 1);
      fStack_288c = (float)((uint)bVar44 * 0x5d5e0b6b | (uint)!bVar44 * auVar56._20_4_);
      bVar44 = (bool)((byte)(uVar47 >> 6) & 1);
      fStack_2888 = (float)((uint)bVar44 * 0x5d5e0b6b | (uint)!bVar44 * auVar56._24_4_);
      bVar44 = SUB81(uVar47 >> 7,0);
      uStack_2884 = (uint)bVar44 * 0x5d5e0b6b | (uint)!bVar44 * auVar56._28_4_;
      bVar44 = (bool)((byte)uVar11 & 1);
      local_2880._0_4_ = (uint)bVar44 * 0x5d5e0b6b | (uint)!bVar44 * auVar53._0_4_;
      bVar44 = (bool)((byte)(uVar11 >> 1) & 1);
      local_2880._4_4_ = (uint)bVar44 * 0x5d5e0b6b | (uint)!bVar44 * auVar53._4_4_;
      bVar44 = (bool)((byte)(uVar11 >> 2) & 1);
      fStack_2878 = (float)((uint)bVar44 * 0x5d5e0b6b | (uint)!bVar44 * auVar53._8_4_);
      bVar44 = (bool)((byte)(uVar11 >> 3) & 1);
      fStack_2874 = (float)((uint)bVar44 * 0x5d5e0b6b | (uint)!bVar44 * auVar53._12_4_);
      bVar44 = (bool)((byte)(uVar11 >> 4) & 1);
      fStack_2870 = (float)((uint)bVar44 * 0x5d5e0b6b | (uint)!bVar44 * auVar53._16_4_);
      bVar44 = (bool)((byte)(uVar11 >> 5) & 1);
      fStack_286c = (float)((uint)bVar44 * 0x5d5e0b6b | (uint)!bVar44 * auVar53._20_4_);
      bVar44 = (bool)((byte)(uVar11 >> 6) & 1);
      fStack_2868 = (float)((uint)bVar44 * 0x5d5e0b6b | (uint)!bVar44 * auVar53._24_4_);
      bVar44 = SUB81(uVar11 >> 7,0);
      uStack_2864 = (uint)bVar44 * 0x5d5e0b6b | (uint)!bVar44 * auVar53._28_4_;
      auVar51 = vxorps_avx512vl(in_ZMM28._0_16_,in_ZMM28._0_16_);
      auVar116 = ZEXT1664(auVar51);
      uVar37 = vcmpps_avx512vl(local_28c0,ZEXT1632(auVar51),1);
      auVar53 = vpbroadcastd_avx512vl(ZEXT416(0x10));
      local_2860._4_4_ = (uint)((byte)(uVar37 >> 1) & 1) * auVar53._4_4_;
      local_2860._0_4_ = (uint)((byte)uVar37 & 1) * auVar53._0_4_;
      local_2860._8_4_ = (uint)((byte)(uVar37 >> 2) & 1) * auVar53._8_4_;
      local_2860._12_4_ = (uint)((byte)(uVar37 >> 3) & 1) * auVar53._12_4_;
      local_2860._16_4_ = (uint)((byte)(uVar37 >> 4) & 1) * auVar53._16_4_;
      local_2860._20_4_ = (uint)((byte)(uVar37 >> 5) & 1) * auVar53._20_4_;
      local_2860._24_4_ = (uint)((byte)(uVar37 >> 6) & 1) * auVar53._24_4_;
      local_2860._28_4_ = (uint)(byte)(uVar37 >> 7) * auVar53._28_4_;
      uVar37 = vcmpps_avx512vl(_local_28a0,ZEXT1632(auVar51),5);
      auVar53 = vpbroadcastd_avx512vl(ZEXT416(0x20));
      bVar44 = (bool)((byte)uVar37 & 1);
      local_2840 = (uint)bVar44 * auVar53._0_4_ | (uint)!bVar44 * 0x30;
      bVar44 = (bool)((byte)(uVar37 >> 1) & 1);
      uStack_283c = (uint)bVar44 * auVar53._4_4_ | (uint)!bVar44 * 0x30;
      bVar44 = (bool)((byte)(uVar37 >> 2) & 1);
      uStack_2838 = (uint)bVar44 * auVar53._8_4_ | (uint)!bVar44 * 0x30;
      bVar44 = (bool)((byte)(uVar37 >> 3) & 1);
      uStack_2834 = (uint)bVar44 * auVar53._12_4_ | (uint)!bVar44 * 0x30;
      bVar44 = (bool)((byte)(uVar37 >> 4) & 1);
      uStack_2830 = (uint)bVar44 * auVar53._16_4_ | (uint)!bVar44 * 0x30;
      bVar44 = (bool)((byte)(uVar37 >> 5) & 1);
      uStack_282c = (uint)bVar44 * auVar53._20_4_ | (uint)!bVar44 * 0x30;
      bVar44 = (bool)((byte)(uVar37 >> 6) & 1);
      uStack_2828 = (uint)bVar44 * auVar53._24_4_ | (uint)!bVar44 * 0x30;
      bVar44 = SUB81(uVar37 >> 7,0);
      uStack_2824 = (uint)bVar44 * auVar53._28_4_ | (uint)!bVar44 * 0x30;
      auVar54 = ZEXT1632(auVar51);
      uVar37 = vcmpps_avx512vl(_local_2880,auVar54,5);
      auVar53 = vpbroadcastd_avx512vl(ZEXT416(0x40));
      bVar44 = (bool)((byte)uVar37 & 1);
      local_2820 = (uint)bVar44 * auVar53._0_4_ | (uint)!bVar44 * 0x50;
      bVar44 = (bool)((byte)(uVar37 >> 1) & 1);
      uStack_281c = (uint)bVar44 * auVar53._4_4_ | (uint)!bVar44 * 0x50;
      bVar44 = (bool)((byte)(uVar37 >> 2) & 1);
      uStack_2818 = (uint)bVar44 * auVar53._8_4_ | (uint)!bVar44 * 0x50;
      bVar44 = (bool)((byte)(uVar37 >> 3) & 1);
      uStack_2814 = (uint)bVar44 * auVar53._12_4_ | (uint)!bVar44 * 0x50;
      bVar44 = (bool)((byte)(uVar37 >> 4) & 1);
      uStack_2810 = (uint)bVar44 * auVar53._16_4_ | (uint)!bVar44 * 0x50;
      bVar44 = (bool)((byte)(uVar37 >> 5) & 1);
      uStack_280c = (uint)bVar44 * auVar53._20_4_ | (uint)!bVar44 * 0x50;
      bVar44 = (bool)((byte)(uVar37 >> 6) & 1);
      uStack_2808 = (uint)bVar44 * auVar53._24_4_ | (uint)!bVar44 * 0x50;
      bVar44 = SUB81(uVar37 >> 7,0);
      uStack_2804 = (uint)bVar44 * auVar53._28_4_ | (uint)!bVar44 * 0x50;
      local_1e80 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar117 = ZEXT3264(local_1e80);
      auVar53 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x60),auVar54);
      local_2800 = (uint)(bVar36 & 1) * auVar53._0_4_ | (uint)!(bool)(bVar36 & 1) * local_1e80._0_4_
      ;
      bVar44 = (bool)((byte)(uVar45 >> 1) & 1);
      uStack_27fc = (uint)bVar44 * auVar53._4_4_ | (uint)!bVar44 * local_1e80._4_4_;
      bVar44 = (bool)((byte)(uVar45 >> 2) & 1);
      uStack_27f8 = (uint)bVar44 * auVar53._8_4_ | (uint)!bVar44 * local_1e80._8_4_;
      bVar44 = (bool)((byte)(uVar45 >> 3) & 1);
      uStack_27f4 = (uint)bVar44 * auVar53._12_4_ | (uint)!bVar44 * local_1e80._12_4_;
      bVar44 = (bool)((byte)(uVar45 >> 4) & 1);
      uStack_27f0 = (uint)bVar44 * auVar53._16_4_ | (uint)!bVar44 * local_1e80._16_4_;
      bVar44 = (bool)((byte)(uVar45 >> 5) & 1);
      uStack_27ec = (uint)bVar44 * auVar53._20_4_ | (uint)!bVar44 * local_1e80._20_4_;
      bVar44 = (bool)((byte)(uVar45 >> 6) & 1);
      uStack_27e8 = (uint)bVar44 * auVar53._24_4_ | (uint)!bVar44 * local_1e80._24_4_;
      bVar44 = SUB81(uVar45 >> 7,0);
      uStack_27e4 = (uint)bVar44 * auVar53._28_4_ | (uint)!bVar44 * local_1e80._28_4_;
      auVar57 = vmaxps_avx512vl(auVar57,auVar54);
      local_27e0._0_4_ = (uint)(bVar36 & 1) * auVar57._0_4_ | (uint)!(bool)(bVar36 & 1) * -0x800000;
      bVar44 = (bool)((byte)(uVar45 >> 1) & 1);
      local_27e0._4_4_ = (uint)bVar44 * auVar57._4_4_ | (uint)!bVar44 * -0x800000;
      bVar44 = (bool)((byte)(uVar45 >> 2) & 1);
      local_27e0._8_4_ = (uint)bVar44 * auVar57._8_4_ | (uint)!bVar44 * -0x800000;
      bVar44 = (bool)((byte)(uVar45 >> 3) & 1);
      local_27e0._12_4_ = (uint)bVar44 * auVar57._12_4_ | (uint)!bVar44 * -0x800000;
      bVar44 = (bool)((byte)(uVar45 >> 4) & 1);
      local_27e0._16_4_ = (uint)bVar44 * auVar57._16_4_ | (uint)!bVar44 * -0x800000;
      bVar44 = (bool)((byte)(uVar45 >> 5) & 1);
      local_27e0._20_4_ = (uint)bVar44 * auVar57._20_4_ | (uint)!bVar44 * -0x800000;
      bVar44 = (bool)((byte)(uVar45 >> 6) & 1);
      local_27e0._24_4_ = (uint)bVar44 * auVar57._24_4_ | (uint)!bVar44 * -0x800000;
      bVar44 = SUB81(uVar45 >> 7,0);
      local_27e0._28_4_ = (uint)bVar44 * auVar57._28_4_ | (uint)!bVar44 * -0x800000;
      bVar36 = ~bVar36;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar42 = 5;
      }
      else {
        uVar42 = (uint)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                       RTC_RAY_QUERY_FLAG_INCOHERENT) * 3 + 2;
      }
      puVar41 = local_2600;
      local_2610 = 0xfffffffffffffff8;
      pauVar43 = (undefined1 (*) [32])local_1e40;
      local_2608 = (bvh->root).ptr;
      local_1e60 = local_2800;
      uStack_1e5c = uStack_27fc;
      uStack_1e58 = uStack_27f8;
      uStack_1e54 = uStack_27f4;
      uStack_1e50 = uStack_27f0;
      uStack_1e4c = uStack_27ec;
      uStack_1e48 = uStack_27e8;
      uStack_1e44 = uStack_27e4;
      auVar57 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
      auVar118 = ZEXT3264(auVar57);
      auVar57 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
      auVar112 = ZEXT3264(auVar57);
      do {
        pauVar43 = pauVar43 + -1;
        root.ptr = puVar41[-1];
        puVar41 = puVar41 + -1;
        if (root.ptr == 0xfffffffffffffff8) {
LAB_007b4eaa:
          iVar48 = 3;
        }
        else {
          auVar57 = *pauVar43;
          uVar37 = vcmpps_avx512vl(auVar57,local_27e0,1);
          if ((char)uVar37 == '\0') {
LAB_007b4eae:
            iVar48 = 2;
          }
          else {
            uVar39 = (undefined4)uVar37;
            iVar48 = 0;
            if ((uint)POPCOUNT(uVar39) <= uVar42) {
              do {
                k = 0;
                for (uVar47 = uVar37; (uVar47 & 1) == 0; uVar47 = uVar47 >> 1 | 0x8000000000000000)
                {
                  k = k + 1;
                }
                auVar106 = ZEXT1664(auVar106._0_16_);
                auVar108 = ZEXT1664(auVar108._0_16_);
                auVar110 = ZEXT1664(auVar110._0_16_);
                bVar44 = occluded1(This,bvh,root,k,(Precalculations *)&local_27c0,ray,
                                   (TravRayK<8,_true> *)&local_2980.field_0,context);
                bVar35 = (byte)(1 << ((uint)k & 0x1f));
                if (!bVar44) {
                  bVar35 = 0;
                }
                bVar36 = bVar36 | bVar35;
                uVar37 = uVar37 - 1 & uVar37;
              } while (uVar37 != 0);
              if (bVar36 == 0xff) {
                iVar48 = 3;
              }
              else {
                auVar53 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                local_27e0._0_4_ =
                     (uint)(bVar36 & 1) * auVar53._0_4_ |
                     (uint)!(bool)(bVar36 & 1) * local_27e0._0_4_;
                bVar44 = (bool)(bVar36 >> 1 & 1);
                local_27e0._4_4_ = (uint)bVar44 * auVar53._4_4_ | (uint)!bVar44 * local_27e0._4_4_;
                bVar44 = (bool)(bVar36 >> 2 & 1);
                local_27e0._8_4_ = (uint)bVar44 * auVar53._8_4_ | (uint)!bVar44 * local_27e0._8_4_;
                bVar44 = (bool)(bVar36 >> 3 & 1);
                local_27e0._12_4_ =
                     (uint)bVar44 * auVar53._12_4_ | (uint)!bVar44 * local_27e0._12_4_;
                bVar44 = (bool)(bVar36 >> 4 & 1);
                local_27e0._16_4_ =
                     (uint)bVar44 * auVar53._16_4_ | (uint)!bVar44 * local_27e0._16_4_;
                bVar44 = (bool)(bVar36 >> 5 & 1);
                local_27e0._20_4_ =
                     (uint)bVar44 * auVar53._20_4_ | (uint)!bVar44 * local_27e0._20_4_;
                bVar44 = (bool)(bVar36 >> 6 & 1);
                local_27e0._24_4_ =
                     (uint)bVar44 * auVar53._24_4_ | (uint)!bVar44 * local_27e0._24_4_;
                local_27e0._28_4_ =
                     (uint)(bVar36 >> 7) * auVar53._28_4_ |
                     (uint)!(bool)(bVar36 >> 7) * local_27e0._28_4_;
                iVar48 = 2;
              }
              uVar45 = uVar45 & 0xffffffff;
              auVar53 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
              auVar114 = ZEXT3264(auVar53);
              auVar53 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
              auVar115 = ZEXT3264(auVar53);
              auVar51 = vxorps_avx512vl(auVar116._0_16_,auVar116._0_16_);
              auVar116 = ZEXT1664(auVar51);
              auVar53 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
              auVar117 = ZEXT3264(auVar53);
              auVar53 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
              auVar118 = ZEXT3264(auVar53);
              auVar53 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
              auVar112 = ZEXT3264(auVar53);
            }
            auVar51 = auVar116._0_16_;
            auVar113 = ZEXT3264(auVar57);
            if (uVar42 < (uint)POPCOUNT(uVar39)) {
              do {
                auVar57 = auVar113._0_32_;
                if ((root.ptr & 8) != 0) {
                  if (root.ptr == 0xfffffffffffffff8) goto LAB_007b4eaa;
                  uVar10 = vcmpps_avx512vl(auVar57,local_27e0,9);
                  if ((char)uVar10 != '\0') {
                    if (bVar36 == 0xff) {
                      bVar35 = 0;
                    }
                    else {
                      uVar37 = (ulong)(byte)~bVar36;
                      bVar1 = *(byte *)(root.ptr & 0xfffffffffffffff0);
                      pvVar2 = This->leafIntersector;
                      bVar35 = 0;
                      do {
                        lVar40 = 0;
                        for (uVar47 = uVar37; (uVar47 & 1) == 0;
                            uVar47 = uVar47 >> 1 | 0x8000000000000000) {
                          lVar40 = lVar40 + 1;
                        }
                        auVar106 = ZEXT1664(auVar106._0_16_);
                        auVar108 = ZEXT1664(auVar108._0_16_);
                        auVar110 = ZEXT1664(auVar110._0_16_);
                        cVar34 = (**(code **)((long)pvVar2 + (ulong)bVar1 * 0x40 + 0x28))
                                           (&local_27c0,ray,lVar40,context,
                                            (byte *)(root.ptr & 0xfffffffffffffff0));
                        auVar51 = auVar116._0_16_;
                        bVar25 = (byte)(1 << ((uint)lVar40 & 0x1f));
                        if (cVar34 == '\0') {
                          bVar25 = 0;
                        }
                        bVar35 = bVar35 | bVar25;
                        uVar37 = uVar37 - 1 & uVar37;
                      } while (uVar37 != 0);
                    }
                    bVar36 = bVar36 | bVar35;
                    if (bVar36 == 0xff) {
                      iVar48 = 3;
                    }
                    else {
                      auVar57 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                      local_27e0._0_4_ =
                           (uint)(bVar36 & 1) * auVar57._0_4_ |
                           (uint)!(bool)(bVar36 & 1) * local_27e0._0_4_;
                      bVar44 = (bool)(bVar36 >> 1 & 1);
                      local_27e0._4_4_ =
                           (uint)bVar44 * auVar57._4_4_ | (uint)!bVar44 * local_27e0._4_4_;
                      bVar44 = (bool)(bVar36 >> 2 & 1);
                      local_27e0._8_4_ =
                           (uint)bVar44 * auVar57._8_4_ | (uint)!bVar44 * local_27e0._8_4_;
                      bVar44 = (bool)(bVar36 >> 3 & 1);
                      local_27e0._12_4_ =
                           (uint)bVar44 * auVar57._12_4_ | (uint)!bVar44 * local_27e0._12_4_;
                      bVar44 = (bool)(bVar36 >> 4 & 1);
                      local_27e0._16_4_ =
                           (uint)bVar44 * auVar57._16_4_ | (uint)!bVar44 * local_27e0._16_4_;
                      bVar44 = (bool)(bVar36 >> 5 & 1);
                      local_27e0._20_4_ =
                           (uint)bVar44 * auVar57._20_4_ | (uint)!bVar44 * local_27e0._20_4_;
                      bVar44 = (bool)(bVar36 >> 6 & 1);
                      local_27e0._24_4_ =
                           (uint)bVar44 * auVar57._24_4_ | (uint)!bVar44 * local_27e0._24_4_;
                      local_27e0._28_4_ =
                           (uint)(bVar36 >> 7) * auVar57._28_4_ |
                           (uint)!(bool)(bVar36 >> 7) * local_27e0._28_4_;
                      iVar48 = 0;
                    }
                    uVar45 = uVar45 & 0xffffffff;
                    auVar57 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
                    auVar114 = ZEXT3264(auVar57);
                    auVar57 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar115 = ZEXT3264(auVar57);
                    auVar51 = vxorps_avx512vl(auVar51,auVar51);
                    auVar116 = ZEXT1664(auVar51);
                    auVar57 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                    auVar117 = ZEXT3264(auVar57);
                    auVar57 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                    auVar118 = ZEXT3264(auVar57);
                    auVar57 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                    auVar112 = ZEXT3264(auVar57);
                    break;
                  }
                  goto LAB_007b4eae;
                }
                uVar47 = root.ptr & 0xfffffffffffffff0;
                uVar38 = (uint)root.ptr & 7;
                root.ptr = 8;
                auVar113 = ZEXT3264(auVar117._0_32_);
                uVar37 = 0;
                do {
                  uVar11 = *(ulong *)(uVar47 + uVar37 * 8);
                  if (uVar11 != 8) {
                    auVar107._28_36_ = auVar106._28_36_;
                    if ((uVar38 == 6) || (uVar38 == 1)) {
                      uVar39 = *(undefined4 *)(uVar47 + 0x80 + uVar37 * 4);
                      auVar77._4_4_ = uVar39;
                      auVar77._0_4_ = uVar39;
                      auVar77._8_4_ = uVar39;
                      auVar77._12_4_ = uVar39;
                      auVar77._16_4_ = uVar39;
                      auVar77._20_4_ = uVar39;
                      auVar77._24_4_ = uVar39;
                      auVar77._28_4_ = uVar39;
                      auVar53 = *(undefined1 (*) [32])(ray + 0xe0);
                      uVar39 = *(undefined4 *)(uVar47 + 0x20 + uVar37 * 4);
                      auVar52._4_4_ = uVar39;
                      auVar52._0_4_ = uVar39;
                      auVar52._8_4_ = uVar39;
                      auVar52._12_4_ = uVar39;
                      auVar52._16_4_ = uVar39;
                      auVar52._20_4_ = uVar39;
                      auVar52._24_4_ = uVar39;
                      auVar52._28_4_ = uVar39;
                      auVar54 = vfmadd213ps_avx512vl(auVar77,auVar53,auVar52);
                      uVar39 = *(undefined4 *)(uVar47 + 0xa0 + uVar37 * 4);
                      auVar80._4_4_ = uVar39;
                      auVar80._0_4_ = uVar39;
                      auVar80._8_4_ = uVar39;
                      auVar80._12_4_ = uVar39;
                      auVar80._16_4_ = uVar39;
                      auVar80._20_4_ = uVar39;
                      auVar80._24_4_ = uVar39;
                      auVar80._28_4_ = uVar39;
                      uVar39 = *(undefined4 *)(uVar47 + 0x40 + uVar37 * 4);
                      auVar56._4_4_ = uVar39;
                      auVar56._0_4_ = uVar39;
                      auVar56._8_4_ = uVar39;
                      auVar56._12_4_ = uVar39;
                      auVar56._16_4_ = uVar39;
                      auVar56._20_4_ = uVar39;
                      auVar56._24_4_ = uVar39;
                      auVar56._28_4_ = uVar39;
                      auVar55 = vfmadd213ps_avx512vl(auVar80,auVar53,auVar56);
                      uVar39 = *(undefined4 *)(uVar47 + 0xc0 + uVar37 * 4);
                      auVar84._4_4_ = uVar39;
                      auVar84._0_4_ = uVar39;
                      auVar84._8_4_ = uVar39;
                      auVar84._12_4_ = uVar39;
                      auVar84._16_4_ = uVar39;
                      auVar84._20_4_ = uVar39;
                      auVar84._24_4_ = uVar39;
                      auVar84._28_4_ = uVar39;
                      uVar39 = *(undefined4 *)(uVar47 + 0x60 + uVar37 * 4);
                      auVar59._4_4_ = uVar39;
                      auVar59._0_4_ = uVar39;
                      auVar59._8_4_ = uVar39;
                      auVar59._12_4_ = uVar39;
                      auVar59._16_4_ = uVar39;
                      auVar59._20_4_ = uVar39;
                      auVar59._24_4_ = uVar39;
                      auVar59._28_4_ = uVar39;
                      auVar52 = vfmadd213ps_avx512vl(auVar84,auVar53,auVar59);
                      uVar39 = *(undefined4 *)(uVar47 + 0x90 + uVar37 * 4);
                      auVar92._4_4_ = uVar39;
                      auVar92._0_4_ = uVar39;
                      auVar92._8_4_ = uVar39;
                      auVar92._12_4_ = uVar39;
                      auVar92._16_4_ = uVar39;
                      auVar92._20_4_ = uVar39;
                      auVar92._24_4_ = uVar39;
                      auVar92._28_4_ = uVar39;
                      uVar39 = *(undefined4 *)(uVar47 + 0x30 + uVar37 * 4);
                      auVar60._4_4_ = uVar39;
                      auVar60._0_4_ = uVar39;
                      auVar60._8_4_ = uVar39;
                      auVar60._12_4_ = uVar39;
                      auVar60._16_4_ = uVar39;
                      auVar60._20_4_ = uVar39;
                      auVar60._24_4_ = uVar39;
                      auVar60._28_4_ = uVar39;
                      auVar56 = vfmadd213ps_avx512vl(auVar92,auVar53,auVar60);
                      uVar39 = *(undefined4 *)(uVar47 + 0xb0 + uVar37 * 4);
                      auVar94._4_4_ = uVar39;
                      auVar94._0_4_ = uVar39;
                      auVar94._8_4_ = uVar39;
                      auVar94._12_4_ = uVar39;
                      auVar94._16_4_ = uVar39;
                      auVar94._20_4_ = uVar39;
                      auVar94._24_4_ = uVar39;
                      auVar94._28_4_ = uVar39;
                      uVar39 = *(undefined4 *)(uVar47 + 0x50 + uVar37 * 4);
                      auVar61._4_4_ = uVar39;
                      auVar61._0_4_ = uVar39;
                      auVar61._8_4_ = uVar39;
                      auVar61._12_4_ = uVar39;
                      auVar61._16_4_ = uVar39;
                      auVar61._20_4_ = uVar39;
                      auVar61._24_4_ = uVar39;
                      auVar61._28_4_ = uVar39;
                      auVar58 = vfmadd213ps_avx512vl(auVar94,auVar53,auVar61);
                      uVar39 = *(undefined4 *)(uVar47 + 0xd0 + uVar37 * 4);
                      auVar96._4_4_ = uVar39;
                      auVar96._0_4_ = uVar39;
                      auVar96._8_4_ = uVar39;
                      auVar96._12_4_ = uVar39;
                      auVar96._16_4_ = uVar39;
                      auVar96._20_4_ = uVar39;
                      auVar96._24_4_ = uVar39;
                      auVar96._28_4_ = uVar39;
                      uVar39 = *(undefined4 *)(uVar47 + 0x70 + uVar37 * 4);
                      auVar62._4_4_ = uVar39;
                      auVar62._0_4_ = uVar39;
                      auVar62._8_4_ = uVar39;
                      auVar62._12_4_ = uVar39;
                      auVar62._16_4_ = uVar39;
                      auVar62._20_4_ = uVar39;
                      auVar62._24_4_ = uVar39;
                      auVar62._28_4_ = uVar39;
                      auVar59 = vfmadd213ps_avx512vl(auVar96,auVar53,auVar62);
                      auVar26._8_8_ = local_2980._8_8_;
                      auVar26._0_8_ = local_2980._0_8_;
                      auVar26._16_8_ = local_2980._16_8_;
                      auVar26._24_8_ = local_2980._24_8_;
                      auVar28._8_8_ = local_2980._40_8_;
                      auVar28._0_8_ = local_2980._32_8_;
                      auVar28._16_8_ = local_2980._48_8_;
                      auVar28._24_8_ = local_2980._56_8_;
                      auVar30._8_8_ = local_2980._72_8_;
                      auVar30._0_8_ = local_2980._64_8_;
                      auVar30._16_8_ = local_2980._80_8_;
                      auVar30._24_8_ = local_2980._88_8_;
                      auVar54 = vsubps_avx(auVar54,auVar26);
                      auVar107._0_4_ = local_28c0._0_4_ * auVar54._0_4_;
                      auVar107._4_4_ = local_28c0._4_4_ * auVar54._4_4_;
                      auVar107._8_4_ = local_28c0._8_4_ * auVar54._8_4_;
                      auVar107._12_4_ = local_28c0._12_4_ * auVar54._12_4_;
                      auVar107._16_4_ = local_28c0._16_4_ * auVar54._16_4_;
                      auVar107._20_4_ = local_28c0._20_4_ * auVar54._20_4_;
                      auVar107._24_4_ = local_28c0._24_4_ * auVar54._24_4_;
                      auVar60 = auVar107._0_32_;
                      auVar106 = ZEXT3264(auVar60);
                      auVar54 = vsubps_avx(auVar55,auVar28);
                      auVar109._0_4_ = auVar54._0_4_ * (float)local_28a0._0_4_;
                      auVar109._4_4_ = auVar54._4_4_ * (float)local_28a0._4_4_;
                      auVar109._8_4_ = auVar54._8_4_ * fStack_2898;
                      auVar109._12_4_ = auVar54._12_4_ * fStack_2894;
                      auVar109._16_4_ = auVar54._16_4_ * fStack_2890;
                      auVar109._20_4_ = auVar54._20_4_ * fStack_288c;
                      auVar109._28_36_ = auVar108._28_36_;
                      auVar109._24_4_ = auVar54._24_4_ * fStack_2888;
                      auVar61 = auVar109._0_32_;
                      auVar108 = ZEXT3264(auVar61);
                      auVar54 = vsubps_avx(auVar52,auVar30);
                      auVar111._0_4_ = auVar54._0_4_ * (float)local_2880._0_4_;
                      auVar111._4_4_ = auVar54._4_4_ * (float)local_2880._4_4_;
                      auVar111._8_4_ = auVar54._8_4_ * fStack_2878;
                      auVar111._12_4_ = auVar54._12_4_ * fStack_2874;
                      auVar111._16_4_ = auVar54._16_4_ * fStack_2870;
                      auVar111._20_4_ = auVar54._20_4_ * fStack_286c;
                      auVar111._28_36_ = auVar110._28_36_;
                      auVar111._24_4_ = auVar54._24_4_ * fStack_2868;
                      auVar62 = auVar111._0_32_;
                      auVar110 = ZEXT3264(auVar62);
                      auVar54 = vsubps_avx(auVar56,auVar26);
                      auVar66._4_4_ = local_28c0._4_4_ * auVar54._4_4_;
                      auVar66._0_4_ = local_28c0._0_4_ * auVar54._0_4_;
                      auVar66._8_4_ = local_28c0._8_4_ * auVar54._8_4_;
                      auVar66._12_4_ = local_28c0._12_4_ * auVar54._12_4_;
                      auVar66._16_4_ = local_28c0._16_4_ * auVar54._16_4_;
                      auVar66._20_4_ = local_28c0._20_4_ * auVar54._20_4_;
                      auVar66._24_4_ = local_28c0._24_4_ * auVar54._24_4_;
                      auVar66._28_4_ = auVar56._28_4_;
                      auVar54 = vsubps_avx(auVar58,auVar28);
                      auVar67._4_4_ = auVar54._4_4_ * (float)local_28a0._4_4_;
                      auVar67._0_4_ = auVar54._0_4_ * (float)local_28a0._0_4_;
                      auVar67._8_4_ = auVar54._8_4_ * fStack_2898;
                      auVar67._12_4_ = auVar54._12_4_ * fStack_2894;
                      auVar67._16_4_ = auVar54._16_4_ * fStack_2890;
                      auVar67._20_4_ = auVar54._20_4_ * fStack_288c;
                      auVar67._24_4_ = auVar54._24_4_ * fStack_2888;
                      auVar67._28_4_ = uStack_2884;
                      auVar54 = vsubps_avx(auVar59,auVar30);
                      auVar68._4_4_ = auVar54._4_4_ * (float)local_2880._4_4_;
                      auVar68._0_4_ = auVar54._0_4_ * (float)local_2880._0_4_;
                      auVar68._8_4_ = auVar54._8_4_ * fStack_2878;
                      auVar68._12_4_ = auVar54._12_4_ * fStack_2874;
                      auVar68._16_4_ = auVar54._16_4_ * fStack_2870;
                      auVar68._20_4_ = auVar54._20_4_ * fStack_286c;
                      auVar68._24_4_ = auVar54._24_4_ * fStack_2868;
                      auVar68._28_4_ = uStack_2864;
                      auVar54 = vpminsd_avx2(auVar60,auVar66);
                      auVar55 = vpminsd_avx2(auVar61,auVar67);
                      auVar54 = vpmaxsd_avx2(auVar54,auVar55);
                      auVar55 = vpminsd_avx2(auVar62,auVar68);
                      auVar54 = vpmaxsd_avx2(auVar54,auVar55);
                      auVar52 = vmulps_avx512vl(auVar54,auVar118._0_32_);
                      auVar54 = vpmaxsd_avx2(auVar60,auVar66);
                      auVar55 = vpmaxsd_avx2(auVar61,auVar67);
                      auVar55 = vpminsd_avx2(auVar54,auVar55);
                      auVar54 = vpmaxsd_avx2(auVar62,auVar68);
                      auVar54 = vpminsd_avx2(auVar55,auVar54);
                      auVar55 = vmulps_avx512vl(auVar54,auVar112._0_32_);
                      auVar32._4_4_ = uStack_27fc;
                      auVar32._0_4_ = local_2800;
                      auVar32._8_4_ = uStack_27f8;
                      auVar32._12_4_ = uStack_27f4;
                      auVar32._16_4_ = uStack_27f0;
                      auVar32._20_4_ = uStack_27ec;
                      auVar32._24_4_ = uStack_27e8;
                      auVar32._28_4_ = uStack_27e4;
                      auVar54 = vpmaxsd_avx2(auVar52,auVar32);
                      auVar55 = vpminsd_avx2(auVar55,local_27e0);
                      uVar46 = vcmpps_avx512vl(auVar54,auVar55,2);
                      if (uVar38 == 6) {
                        uVar39 = *(undefined4 *)(uVar47 + 0xe0 + uVar37 * 4);
                        auVar14._4_4_ = uVar39;
                        auVar14._0_4_ = uVar39;
                        auVar14._8_4_ = uVar39;
                        auVar14._12_4_ = uVar39;
                        auVar14._16_4_ = uVar39;
                        auVar14._20_4_ = uVar39;
                        auVar14._24_4_ = uVar39;
                        auVar14._28_4_ = uVar39;
                        uVar12 = vcmpps_avx512vl(auVar53,auVar14,0xd);
                        uVar39 = *(undefined4 *)(uVar47 + 0xf0 + uVar37 * 4);
                        auVar15._4_4_ = uVar39;
                        auVar15._0_4_ = uVar39;
                        auVar15._8_4_ = uVar39;
                        auVar15._12_4_ = uVar39;
                        auVar15._16_4_ = uVar39;
                        auVar15._20_4_ = uVar39;
                        auVar15._24_4_ = uVar39;
                        auVar15._28_4_ = uVar39;
                        uVar13 = vcmpps_avx512vl(auVar53,auVar15,1);
                        uVar46 = uVar46 & uVar12 & uVar13;
                      }
                    }
                    else {
                      uVar39 = *(undefined4 *)(uVar47 + 0x20 + uVar37 * 4);
                      auVar95._4_4_ = uVar39;
                      auVar95._0_4_ = uVar39;
                      auVar95._8_4_ = uVar39;
                      auVar95._12_4_ = uVar39;
                      auVar95._16_4_ = uVar39;
                      auVar95._20_4_ = uVar39;
                      auVar95._24_4_ = uVar39;
                      auVar95._28_4_ = uVar39;
                      uVar39 = *(undefined4 *)(uVar47 + 0x30 + uVar37 * 4);
                      auVar93._4_4_ = uVar39;
                      auVar93._0_4_ = uVar39;
                      auVar93._8_4_ = uVar39;
                      auVar93._12_4_ = uVar39;
                      auVar93._16_4_ = uVar39;
                      auVar93._20_4_ = uVar39;
                      auVar93._24_4_ = uVar39;
                      auVar93._28_4_ = uVar39;
                      uVar39 = *(undefined4 *)(uVar47 + 0x40 + uVar37 * 4);
                      auVar85._4_4_ = uVar39;
                      auVar85._0_4_ = uVar39;
                      auVar85._8_4_ = uVar39;
                      auVar85._12_4_ = uVar39;
                      auVar85._16_4_ = uVar39;
                      auVar85._20_4_ = uVar39;
                      auVar85._24_4_ = uVar39;
                      auVar85._28_4_ = uVar39;
                      uVar39 = *(undefined4 *)(uVar47 + 0x50 + uVar37 * 4);
                      auVar105._4_4_ = uVar39;
                      auVar105._0_4_ = uVar39;
                      auVar105._8_4_ = uVar39;
                      auVar105._12_4_ = uVar39;
                      auVar105._16_4_ = uVar39;
                      auVar105._20_4_ = uVar39;
                      auVar105._24_4_ = uVar39;
                      auVar105._28_4_ = uVar39;
                      auVar106 = ZEXT3264(auVar105);
                      uVar39 = *(undefined4 *)(uVar47 + 0x60 + uVar37 * 4);
                      auVar102._4_4_ = uVar39;
                      auVar102._0_4_ = uVar39;
                      auVar102._8_4_ = uVar39;
                      auVar102._12_4_ = uVar39;
                      auVar102._16_4_ = uVar39;
                      auVar102._20_4_ = uVar39;
                      auVar102._24_4_ = uVar39;
                      auVar102._28_4_ = uVar39;
                      uVar39 = *(undefined4 *)(uVar47 + 0x70 + uVar37 * 4);
                      auVar100._4_4_ = uVar39;
                      auVar100._0_4_ = uVar39;
                      auVar100._8_4_ = uVar39;
                      auVar100._12_4_ = uVar39;
                      auVar100._16_4_ = uVar39;
                      auVar100._20_4_ = uVar39;
                      auVar100._24_4_ = uVar39;
                      auVar100._28_4_ = uVar39;
                      uVar39 = *(undefined4 *)(uVar47 + 0x80 + uVar37 * 4);
                      auVar81._4_4_ = uVar39;
                      auVar81._0_4_ = uVar39;
                      auVar81._8_4_ = uVar39;
                      auVar81._12_4_ = uVar39;
                      auVar81._16_4_ = uVar39;
                      auVar81._20_4_ = uVar39;
                      auVar81._24_4_ = uVar39;
                      auVar81._28_4_ = uVar39;
                      uVar39 = *(undefined4 *)(uVar47 + 0x90 + uVar37 * 4);
                      auVar78._4_4_ = uVar39;
                      auVar78._0_4_ = uVar39;
                      auVar78._8_4_ = uVar39;
                      auVar78._12_4_ = uVar39;
                      auVar78._16_4_ = uVar39;
                      auVar78._20_4_ = uVar39;
                      auVar78._24_4_ = uVar39;
                      auVar78._28_4_ = uVar39;
                      uVar39 = *(undefined4 *)(uVar47 + 0xa0 + uVar37 * 4);
                      auVar76._4_4_ = uVar39;
                      auVar76._0_4_ = uVar39;
                      auVar76._8_4_ = uVar39;
                      auVar76._12_4_ = uVar39;
                      auVar76._16_4_ = uVar39;
                      auVar76._20_4_ = uVar39;
                      auVar76._24_4_ = uVar39;
                      auVar76._28_4_ = uVar39;
                      auVar53 = *(undefined1 (*) [32])(ray + 0xe0);
                      auVar67 = auVar115._0_32_;
                      auVar54 = vsubps_avx512vl(auVar67,auVar53);
                      uVar39 = *(undefined4 *)(uVar47 + 0xe0 + uVar37 * 4);
                      auVar16._4_4_ = uVar39;
                      auVar16._0_4_ = uVar39;
                      auVar16._8_4_ = uVar39;
                      auVar16._12_4_ = uVar39;
                      auVar16._16_4_ = uVar39;
                      auVar16._20_4_ = uVar39;
                      auVar16._24_4_ = uVar39;
                      auVar16._28_4_ = uVar39;
                      auVar55 = vmulps_avx512vl(auVar53,auVar16);
                      uVar39 = *(undefined4 *)(uVar47 + 0xf0 + uVar37 * 4);
                      auVar17._4_4_ = uVar39;
                      auVar17._0_4_ = uVar39;
                      auVar17._8_4_ = uVar39;
                      auVar17._12_4_ = uVar39;
                      auVar17._16_4_ = uVar39;
                      auVar17._20_4_ = uVar39;
                      auVar17._24_4_ = uVar39;
                      auVar17._28_4_ = uVar39;
                      auVar52 = vmulps_avx512vl(auVar53,auVar17);
                      uVar39 = *(undefined4 *)(uVar47 + 0x100 + uVar37 * 4);
                      auVar18._4_4_ = uVar39;
                      auVar18._0_4_ = uVar39;
                      auVar18._8_4_ = uVar39;
                      auVar18._12_4_ = uVar39;
                      auVar18._16_4_ = uVar39;
                      auVar18._20_4_ = uVar39;
                      auVar18._24_4_ = uVar39;
                      auVar18._28_4_ = uVar39;
                      auVar56 = vmulps_avx512vl(auVar53,auVar18);
                      auVar60 = auVar116._0_32_;
                      auVar55 = vfmadd231ps_avx512vl(auVar55,auVar54,auVar60);
                      auVar52 = vfmadd231ps_avx512vl(auVar52,auVar54,auVar60);
                      uVar39 = *(undefined4 *)(uVar47 + 0x110 + uVar37 * 4);
                      auVar19._4_4_ = uVar39;
                      auVar19._0_4_ = uVar39;
                      auVar19._8_4_ = uVar39;
                      auVar19._12_4_ = uVar39;
                      auVar19._16_4_ = uVar39;
                      auVar19._20_4_ = uVar39;
                      auVar19._24_4_ = uVar39;
                      auVar19._28_4_ = uVar39;
                      auVar58 = vmulps_avx512vl(auVar53,auVar19);
                      uVar39 = *(undefined4 *)(uVar47 + 0x120 + uVar37 * 4);
                      auVar20._4_4_ = uVar39;
                      auVar20._0_4_ = uVar39;
                      auVar20._8_4_ = uVar39;
                      auVar20._12_4_ = uVar39;
                      auVar20._16_4_ = uVar39;
                      auVar20._20_4_ = uVar39;
                      auVar20._24_4_ = uVar39;
                      auVar20._28_4_ = uVar39;
                      auVar59 = vmulps_avx512vl(auVar53,auVar20);
                      uVar39 = *(undefined4 *)(uVar47 + 0x130 + uVar37 * 4);
                      auVar21._4_4_ = uVar39;
                      auVar21._0_4_ = uVar39;
                      auVar21._8_4_ = uVar39;
                      auVar21._12_4_ = uVar39;
                      auVar21._16_4_ = uVar39;
                      auVar21._20_4_ = uVar39;
                      auVar21._24_4_ = uVar39;
                      auVar21._28_4_ = uVar39;
                      auVar53 = vmulps_avx512vl(auVar53,auVar21);
                      auVar56 = vfmadd231ps_avx512vl(auVar56,auVar54,auVar60);
                      auVar58 = vaddps_avx512vl(auVar54,auVar58);
                      auVar59 = vaddps_avx512vl(auVar54,auVar59);
                      auVar110 = ZEXT3264(auVar59);
                      auVar54 = vaddps_avx512vl(auVar54,auVar53);
                      auVar108 = ZEXT3264(auVar54);
                      auVar27._8_8_ = local_2980._8_8_;
                      auVar27._0_8_ = local_2980._0_8_;
                      auVar27._16_8_ = local_2980._16_8_;
                      auVar27._24_8_ = local_2980._24_8_;
                      auVar29._8_8_ = local_2980._40_8_;
                      auVar29._0_8_ = local_2980._32_8_;
                      auVar29._16_8_ = local_2980._48_8_;
                      auVar29._24_8_ = local_2980._56_8_;
                      auVar31._8_8_ = local_2980._72_8_;
                      auVar31._0_8_ = local_2980._64_8_;
                      auVar31._16_8_ = local_2980._80_8_;
                      auVar31._24_8_ = local_2980._88_8_;
                      auVar53 = vmulps_avx512vl(auVar81,local_28e0);
                      auVar60 = vmulps_avx512vl(auVar78,local_28e0);
                      auVar61 = vmulps_avx512vl(auVar76,local_28e0);
                      auVar53 = vfmadd231ps_avx512vl(auVar53,local_2900,auVar105);
                      auVar60 = vfmadd231ps_avx512vl(auVar60,local_2900,auVar102);
                      auVar61 = vfmadd231ps_avx512vl(auVar61,auVar100,local_2900);
                      auVar53 = vfmadd231ps_avx512vl(auVar53,local_2920,auVar95);
                      auVar60 = vfmadd231ps_avx512vl(auVar60,local_2920,auVar93);
                      auVar61 = vfmadd231ps_avx512vl(auVar61,auVar85,local_2920);
                      auVar62 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                      vandps_avx512vl(auVar53,auVar62);
                      auVar66 = auVar114._0_32_;
                      uVar46 = vcmpps_avx512vl(auVar62,auVar66,1);
                      bVar44 = (bool)((byte)uVar46 & 1);
                      iVar48 = auVar114._0_4_;
                      auVar63._0_4_ = (uint)bVar44 * iVar48 | (uint)!bVar44 * auVar53._0_4_;
                      bVar44 = (bool)((byte)(uVar46 >> 1) & 1);
                      iVar69 = auVar114._4_4_;
                      auVar63._4_4_ = (uint)bVar44 * iVar69 | (uint)!bVar44 * auVar53._4_4_;
                      bVar44 = (bool)((byte)(uVar46 >> 2) & 1);
                      iVar70 = auVar114._8_4_;
                      auVar63._8_4_ = (uint)bVar44 * iVar70 | (uint)!bVar44 * auVar53._8_4_;
                      bVar44 = (bool)((byte)(uVar46 >> 3) & 1);
                      iVar71 = auVar114._12_4_;
                      auVar63._12_4_ = (uint)bVar44 * iVar71 | (uint)!bVar44 * auVar53._12_4_;
                      bVar44 = (bool)((byte)(uVar46 >> 4) & 1);
                      iVar72 = auVar114._16_4_;
                      auVar63._16_4_ = (uint)bVar44 * iVar72 | (uint)!bVar44 * auVar53._16_4_;
                      bVar44 = (bool)((byte)(uVar46 >> 5) & 1);
                      iVar73 = auVar114._20_4_;
                      auVar63._20_4_ = (uint)bVar44 * iVar73 | (uint)!bVar44 * auVar53._20_4_;
                      bVar44 = (bool)((byte)(uVar46 >> 6) & 1);
                      iVar74 = auVar114._24_4_;
                      iVar75 = auVar114._28_4_;
                      auVar63._24_4_ = (uint)bVar44 * iVar74 | (uint)!bVar44 * auVar53._24_4_;
                      bVar44 = SUB81(uVar46 >> 7,0);
                      auVar63._28_4_ = (uint)bVar44 * iVar75 | (uint)!bVar44 * auVar53._28_4_;
                      vandps_avx512vl(auVar60,auVar62);
                      uVar46 = vcmpps_avx512vl(auVar63,auVar66,1);
                      bVar44 = (bool)((byte)uVar46 & 1);
                      auVar64._0_4_ = (uint)bVar44 * iVar48 | (uint)!bVar44 * auVar60._0_4_;
                      bVar44 = (bool)((byte)(uVar46 >> 1) & 1);
                      auVar64._4_4_ = (uint)bVar44 * iVar69 | (uint)!bVar44 * auVar60._4_4_;
                      bVar44 = (bool)((byte)(uVar46 >> 2) & 1);
                      auVar64._8_4_ = (uint)bVar44 * iVar70 | (uint)!bVar44 * auVar60._8_4_;
                      bVar44 = (bool)((byte)(uVar46 >> 3) & 1);
                      auVar64._12_4_ = (uint)bVar44 * iVar71 | (uint)!bVar44 * auVar60._12_4_;
                      bVar44 = (bool)((byte)(uVar46 >> 4) & 1);
                      auVar64._16_4_ = (uint)bVar44 * iVar72 | (uint)!bVar44 * auVar60._16_4_;
                      bVar44 = (bool)((byte)(uVar46 >> 5) & 1);
                      auVar64._20_4_ = (uint)bVar44 * iVar73 | (uint)!bVar44 * auVar60._20_4_;
                      bVar44 = (bool)((byte)(uVar46 >> 6) & 1);
                      auVar64._24_4_ = (uint)bVar44 * iVar74 | (uint)!bVar44 * auVar60._24_4_;
                      bVar44 = SUB81(uVar46 >> 7,0);
                      auVar64._28_4_ = (uint)bVar44 * iVar75 | (uint)!bVar44 * auVar60._28_4_;
                      vandps_avx512vl(auVar61,auVar62);
                      uVar46 = vcmpps_avx512vl(auVar64,auVar66,1);
                      bVar44 = (bool)((byte)uVar46 & 1);
                      auVar65._0_4_ = (uint)bVar44 * iVar48 | (uint)!bVar44 * auVar61._0_4_;
                      bVar44 = (bool)((byte)(uVar46 >> 1) & 1);
                      auVar65._4_4_ = (uint)bVar44 * iVar69 | (uint)!bVar44 * auVar61._4_4_;
                      bVar44 = (bool)((byte)(uVar46 >> 2) & 1);
                      auVar65._8_4_ = (uint)bVar44 * iVar70 | (uint)!bVar44 * auVar61._8_4_;
                      bVar44 = (bool)((byte)(uVar46 >> 3) & 1);
                      auVar65._12_4_ = (uint)bVar44 * iVar71 | (uint)!bVar44 * auVar61._12_4_;
                      bVar44 = (bool)((byte)(uVar46 >> 4) & 1);
                      auVar65._16_4_ = (uint)bVar44 * iVar72 | (uint)!bVar44 * auVar61._16_4_;
                      bVar44 = (bool)((byte)(uVar46 >> 5) & 1);
                      auVar65._20_4_ = (uint)bVar44 * iVar73 | (uint)!bVar44 * auVar61._20_4_;
                      bVar44 = (bool)((byte)(uVar46 >> 6) & 1);
                      auVar65._24_4_ = (uint)bVar44 * iVar74 | (uint)!bVar44 * auVar61._24_4_;
                      bVar44 = SUB81(uVar46 >> 7,0);
                      auVar65._28_4_ = (uint)bVar44 * iVar75 | (uint)!bVar44 * auVar61._28_4_;
                      auVar53 = vrcp14ps_avx512vl(auVar63);
                      auVar60 = vfnmadd213ps_avx512vl(auVar63,auVar53,auVar67);
                      auVar60 = vfmadd132ps_avx512vl(auVar60,auVar53,auVar53);
                      auVar53 = vrcp14ps_avx512vl(auVar64);
                      auVar61 = vfnmadd213ps_avx512vl(auVar64,auVar53,auVar67);
                      auVar61 = vfmadd132ps_avx512vl(auVar61,auVar53,auVar53);
                      auVar53 = vrcp14ps_avx512vl(auVar65);
                      auVar62 = vfnmadd213ps_avx512vl(auVar65,auVar53,auVar67);
                      uVar39 = *(undefined4 *)(uVar47 + 0xb0 + uVar37 * 4);
                      auVar22._4_4_ = uVar39;
                      auVar22._0_4_ = uVar39;
                      auVar22._8_4_ = uVar39;
                      auVar22._12_4_ = uVar39;
                      auVar22._16_4_ = uVar39;
                      auVar22._20_4_ = uVar39;
                      auVar22._24_4_ = uVar39;
                      auVar22._28_4_ = uVar39;
                      auVar66 = vfmadd213ps_avx512vl(auVar81,auVar31,auVar22);
                      uVar39 = *(undefined4 *)(uVar47 + 0xc0 + uVar37 * 4);
                      auVar23._4_4_ = uVar39;
                      auVar23._0_4_ = uVar39;
                      auVar23._8_4_ = uVar39;
                      auVar23._12_4_ = uVar39;
                      auVar23._16_4_ = uVar39;
                      auVar23._20_4_ = uVar39;
                      auVar23._24_4_ = uVar39;
                      auVar23._28_4_ = uVar39;
                      auVar67 = vfmadd213ps_avx512vl(auVar78,auVar31,auVar23);
                      uVar39 = *(undefined4 *)(uVar47 + 0xd0 + uVar37 * 4);
                      auVar24._4_4_ = uVar39;
                      auVar24._0_4_ = uVar39;
                      auVar24._8_4_ = uVar39;
                      auVar24._12_4_ = uVar39;
                      auVar24._16_4_ = uVar39;
                      auVar24._20_4_ = uVar39;
                      auVar24._24_4_ = uVar39;
                      auVar24._28_4_ = uVar39;
                      auVar68 = vfmadd213ps_avx512vl(auVar76,auVar31,auVar24);
                      auVar62 = vfmadd132ps_avx512vl(auVar62,auVar53,auVar53);
                      auVar53 = vfmadd231ps_avx512vl(auVar66,auVar29,auVar105);
                      auVar66 = vfmadd231ps_avx512vl(auVar67,auVar29,auVar102);
                      auVar67 = vfmadd231ps_avx512vl(auVar68,auVar29,auVar100);
                      auVar68 = vfmadd231ps_avx512vl(auVar53,auVar27,auVar95);
                      auVar66 = vfmadd231ps_avx512vl(auVar66,auVar27,auVar93);
                      auVar67 = vfmadd231ps_avx512vl(auVar67,auVar27,auVar85);
                      auVar53 = vsubps_avx(auVar55,auVar68);
                      auVar55 = vmulps_avx512vl(auVar60,auVar53);
                      auVar53 = vsubps_avx(auVar52,auVar66);
                      auVar52 = vmulps_avx512vl(auVar61,auVar53);
                      auVar53 = vsubps_avx(auVar56,auVar67);
                      auVar56 = vmulps_avx512vl(auVar62,auVar53);
                      auVar53 = vsubps_avx512vl(auVar58,auVar68);
                      auVar58 = vmulps_avx512vl(auVar60,auVar53);
                      auVar53 = vsubps_avx(auVar59,auVar66);
                      auVar59 = vmulps_avx512vl(auVar61,auVar53);
                      auVar53 = vsubps_avx(auVar54,auVar67);
                      auVar60 = vmulps_avx512vl(auVar62,auVar53);
                      auVar53 = vpminsd_avx2(auVar55,auVar58);
                      auVar54 = vpminsd_avx2(auVar52,auVar59);
                      auVar53 = vpmaxsd_avx2(auVar53,auVar54);
                      auVar54 = vpminsd_avx2(auVar56,auVar60);
                      auVar53 = vpmaxsd_avx2(auVar53,auVar54);
                      auVar54 = vpmaxsd_avx2(auVar55,auVar58);
                      auVar55 = vpmaxsd_avx2(auVar52,auVar59);
                      auVar55 = vpminsd_avx2(auVar54,auVar55);
                      auVar54 = vpmaxsd_avx2(auVar56,auVar60);
                      auVar54 = vpminsd_avx2(auVar55,auVar54);
                      auVar52 = vmulps_avx512vl(auVar53,auVar118._0_32_);
                      auVar53 = vmulps_avx512vl(auVar54,auVar112._0_32_);
                      auVar33._4_4_ = uStack_27fc;
                      auVar33._0_4_ = local_2800;
                      auVar33._8_4_ = uStack_27f8;
                      auVar33._12_4_ = uStack_27f4;
                      auVar33._16_4_ = uStack_27f0;
                      auVar33._20_4_ = uStack_27ec;
                      auVar33._24_4_ = uStack_27e8;
                      auVar33._28_4_ = uStack_27e4;
                      auVar54 = vpmaxsd_avx2(auVar52,auVar33);
                      auVar53 = vpminsd_avx2(auVar53,local_27e0);
                      uVar46 = vcmpps_avx512vl(auVar54,auVar53,2);
                    }
                    uVar12 = vcmpps_avx512vl(local_27e0,auVar57,6);
                    uVar46 = uVar46 & uVar12;
                    if ((byte)uVar46 != 0) {
                      auVar54 = vblendmps_avx512vl(auVar117._0_32_,auVar52);
                      bVar44 = (bool)((byte)uVar46 & 1);
                      bVar3 = (bool)((byte)(uVar46 >> 1) & 1);
                      bVar4 = (bool)((byte)(uVar46 >> 2) & 1);
                      bVar5 = (bool)((byte)(uVar46 >> 3) & 1);
                      bVar6 = (bool)((byte)(uVar46 >> 4) & 1);
                      bVar7 = (bool)((byte)(uVar46 >> 5) & 1);
                      bVar8 = (bool)((byte)(uVar46 >> 6) & 1);
                      bVar9 = SUB81(uVar46 >> 7,0);
                      if (root.ptr != 8) {
                        *puVar41 = root.ptr;
                        puVar41 = puVar41 + 1;
                        *pauVar43 = auVar113._0_32_;
                        pauVar43 = pauVar43 + 1;
                      }
                      auVar113 = ZEXT3264(CONCAT428((uint)bVar9 * auVar54._28_4_ |
                                                    (uint)!bVar9 * auVar53._28_4_,
                                                    CONCAT424((uint)bVar8 * auVar54._24_4_ |
                                                              (uint)!bVar8 * auVar53._24_4_,
                                                              CONCAT420((uint)bVar7 * auVar54._20_4_
                                                                        | (uint)!bVar7 *
                                                                          auVar53._20_4_,
                                                                        CONCAT416((uint)bVar6 *
                                                                                  auVar54._16_4_ |
                                                                                  (uint)!bVar6 *
                                                                                  auVar53._16_4_,
                                                                                  CONCAT412((uint)
                                                  bVar5 * auVar54._12_4_ |
                                                  (uint)!bVar5 * auVar53._12_4_,
                                                  CONCAT48((uint)bVar4 * auVar54._8_4_ |
                                                           (uint)!bVar4 * auVar53._8_4_,
                                                           CONCAT44((uint)bVar3 * auVar54._4_4_ |
                                                                    (uint)!bVar3 * auVar53._4_4_,
                                                                    (uint)bVar44 * auVar54._0_4_ |
                                                                    (uint)!bVar44 * auVar53._0_4_)))
                                                  )))));
                      root.ptr = uVar11;
                    }
                  }
                } while ((uVar11 != 8) && (bVar44 = uVar37 < 3, uVar37 = uVar37 + 1, bVar44));
                iVar48 = 0;
                if (root.ptr == 8) {
LAB_007b4d53:
                  bVar44 = false;
                  iVar48 = 4;
                }
                else {
                  uVar10 = vcmpps_avx512vl(auVar113._0_32_,local_27e0,9);
                  bVar44 = true;
                  if ((uint)POPCOUNT((int)uVar10) <= uVar42) {
                    *puVar41 = root.ptr;
                    puVar41 = puVar41 + 1;
                    *pauVar43 = auVar113._0_32_;
                    pauVar43 = pauVar43 + 1;
                    goto LAB_007b4d53;
                  }
                }
              } while (bVar44);
            }
          }
        }
      } while (iVar48 != 3);
      bVar36 = bVar36 & (byte)uVar45;
      bVar44 = (bool)(bVar36 >> 1 & 1);
      bVar3 = (bool)(bVar36 >> 2 & 1);
      bVar4 = (bool)(bVar36 >> 3 & 1);
      bVar5 = (bool)(bVar36 >> 4 & 1);
      bVar6 = (bool)(bVar36 >> 5 & 1);
      bVar7 = (bool)(bVar36 >> 6 & 1);
      *(uint *)(ray + 0x100) =
           (uint)(bVar36 & 1) * -0x800000 | (uint)!(bool)(bVar36 & 1) * *(int *)(ray + 0x100);
      *(uint *)(ray + 0x104) = (uint)bVar44 * -0x800000 | (uint)!bVar44 * *(int *)(ray + 0x104);
      *(uint *)(ray + 0x108) = (uint)bVar3 * -0x800000 | (uint)!bVar3 * *(int *)(ray + 0x108);
      *(uint *)(ray + 0x10c) = (uint)bVar4 * -0x800000 | (uint)!bVar4 * *(int *)(ray + 0x10c);
      *(uint *)(ray + 0x110) = (uint)bVar5 * -0x800000 | (uint)!bVar5 * *(int *)(ray + 0x110);
      *(uint *)(ray + 0x114) = (uint)bVar6 * -0x800000 | (uint)!bVar6 * *(int *)(ray + 0x114);
      *(uint *)(ray + 0x118) = (uint)bVar7 * -0x800000 | (uint)!bVar7 * *(int *)(ray + 0x118);
      *(uint *)(ray + 0x11c) =
           (uint)(bVar36 >> 7) * -0x800000 | (uint)!(bool)(bVar36 >> 7) * *(int *)(ray + 0x11c);
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }